

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O1

int loop(uchar *pattern,uchar *string,int maxstars)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [4];
  short sVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint unaff_EBX;
  uint uVar13;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  uchar *pp;
  uchar charset [271];
  undefined1 local_170 [4];
  short sStack_16c;
  undefined2 local_168;
  byte *local_160;
  int local_158;
  uint local_154;
  byte *local_150;
  uchar local_148 [256];
  char local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char local_42;
  char local_41;
  char local_40;
  char local_3f;
  char local_3e;
  
  memset(local_148,0,0x10f);
LAB_00126479:
  bVar1 = *pattern;
  pbVar16 = string;
  if (bVar1 < 0x3f) {
    if (bVar1 != 0) {
      if (bVar1 != 0x2a) {
LAB_001268ef:
        pattern = pattern + 1;
        pbVar16 = string + 1;
        if (bVar1 == *string) goto LAB_001268ff;
        unaff_EBX = 1;
        bVar4 = false;
        goto LAB_00126951;
      }
      unaff_EBX = 1;
      if (maxstars == 0) {
        maxstars = 0;
        goto LAB_0012694e;
      }
      do {
        do {
          bVar1 = pattern[1];
          pattern = pattern + 1;
        } while (bVar1 == 0x2a);
        if (bVar1 == 0) goto LAB_0012694c;
        if (bVar1 != 0x3f) {
          maxstars = maxstars + -1;
          pbVar16 = string;
          if (*string == 0) goto LAB_0012694e;
          goto LAB_00126925;
        }
        pbVar16 = string + 1;
        bVar1 = *string;
        string = pbVar16;
      } while (bVar1 != 0);
      goto LAB_00126947;
    }
    unaff_EBX = (uint)(*string != 0);
    goto LAB_0012694e;
  }
  if (bVar1 == 0x3f) {
    if (*string == 0) {
LAB_00126904:
      unaff_EBX = 1;
      goto LAB_0012694e;
    }
    pbVar16 = string + 1;
    pattern = pattern + 1;
LAB_001268ff:
    bVar4 = true;
  }
  else {
    if (bVar1 != 0x5b) {
      if (bVar1 != 0x5c) goto LAB_001268ef;
      pbVar15 = pattern + 1;
      if (pattern[1] == 0) {
        pbVar15 = pattern;
      }
      pbVar16 = string + 1;
      pattern = pbVar15 + 1;
      if (*string != *pbVar15) goto LAB_00126904;
      goto LAB_001268ff;
    }
    iVar10 = 0;
    local_160 = pattern + 1;
    memset(local_148,0,0x10f);
    bVar1 = pattern[1];
    if (bVar1 != 0) {
      bVar4 = false;
      pbVar15 = pattern + 1;
      local_154 = unaff_EBX;
      local_150 = string;
      do {
        uVar13 = local_154;
        if (iVar10 == 2) {
          if (bVar1 != 0x5d) {
            local_148[bVar1] = '\x01';
            goto LAB_001267a9;
          }
LAB_0012695f:
          bVar1 = *pbVar16;
          if (bVar1 == 0) {
            bVar4 = false;
            unaff_EBX = 1;
          }
          else {
            unaff_EBX = 1;
            uVar11 = 1;
            if (local_148[bVar1] == '\0') {
              uVar11 = (uint)bVar1;
              if (local_47 == '\0') {
                if (local_44 == '\0') {
                  if (local_46 == '\0') {
                    if (local_45 == '\0') {
                      if (local_43 == '\0') {
                        if (local_3f == '\0') {
                          if (local_3e == '\0') {
                            if (local_41 == '\0') {
                              if (local_42 == '\0') {
                                if (local_40 == '\0') {
                                  uVar11 = 0;
                                  pbVar16 = local_150;
                                }
                                else {
                                  uVar11 = Curl_isgraph(uVar11);
                                  pbVar16 = local_150;
                                  uVar13 = local_154;
                                }
                              }
                              else {
                                uVar11 = (uint)(uVar11 == 9 || uVar11 == 0x20);
                              }
                            }
                            else {
                              uVar11 = Curl_islower(uVar11);
                            }
                          }
                          else {
                            uVar11 = Curl_isupper(uVar11);
                          }
                        }
                        else {
                          uVar11 = Curl_isspace(uVar11);
                        }
                      }
                      else {
                        uVar11 = Curl_isprint(uVar11);
                      }
                    }
                    else {
                      uVar11 = Curl_isxdigit(uVar11);
                    }
                  }
                  else {
                    uVar11 = Curl_isdigit(uVar11);
                  }
                }
                else {
                  uVar11 = Curl_isalpha(uVar11);
                }
              }
              else {
                uVar11 = Curl_isalnum(uVar11);
              }
            }
            uVar12 = (uint)(uVar11 == 0);
            if (local_48 == '\0') {
              uVar12 = uVar11;
            }
            if (uVar12 == 0) {
              bVar4 = false;
            }
            else {
              pattern = local_160 + 1;
              pbVar16 = pbVar16 + 1;
              bVar4 = true;
              unaff_EBX = uVar13;
            }
          }
          if (bVar4) goto LAB_001268ff;
          bVar4 = false;
          goto LAB_00126951;
        }
        if (iVar10 == 1) {
          if (bVar1 != 0x5b) {
            if (bVar1 == 0x5d) goto LAB_0012695f;
            iVar9 = Curl_isprint((uint)bVar1);
            iVar10 = 0;
            if (iVar9 != 0) {
              local_148[bVar1] = '\x01';
              local_160 = local_160 + 1;
              goto LAB_001268c8;
            }
            break;
          }
          local_148[bVar1] = '\x01';
          local_160 = local_160 + 1;
          iVar10 = 2;
        }
        else {
          if (iVar10 != 0) goto LAB_001268c8;
          switch(bVar1) {
          case 0x5b:
            if (pbVar15[1] == 0x3a) {
              pbVar15 = pbVar15 + 2;
              local_168 = 0;
              _local_170 = 0;
              uVar14 = 0;
              bVar6 = false;
              bVar4 = false;
              local_158 = maxstars;
              do {
                if (uVar14 < 10) {
                  bVar2 = pbVar15[uVar14];
                  if (bVar4) {
                    bVar4 = true;
                    if (bVar2 != 0x5d) goto LAB_001265eb;
                    bVar6 = true;
                    bVar3 = true;
                  }
                  else {
                    iVar10 = Curl_islower((uint)bVar2);
                    if (iVar10 == 0) {
                      bVar4 = false;
                      bVar5 = false;
                      pbVar16 = local_150;
                      bVar3 = true;
                      if (bVar2 != 0x3a) goto LAB_0012662e;
                    }
                    else {
                      local_170[uVar14] = bVar2;
                      pbVar16 = local_150;
                      bVar3 = false;
                    }
                  }
                  bVar4 = bVar3;
                  bVar5 = true;
                }
                else {
LAB_001265eb:
                  bVar5 = false;
                }
LAB_0012662e:
                bVar3 = true;
                if (!bVar5) goto LAB_001268ad;
                uVar14 = uVar14 + 1;
              } while (!bVar6);
              auVar7 = local_170;
              sVar8 = sStack_16c;
              pbVar15 = pbVar15 + uVar14;
              if (sStack_16c == 0x74 && local_170 == (undefined1  [4])0x69676964) {
                local_46 = '\x01';
                bVar3 = false;
              }
              else {
                if (sStack_16c == 0x6d && local_170 == (undefined1  [4])0x756e6c61) {
                  local_47 = '\x01';
                }
                else if (sStack_16c == 0x61 && local_170 == (undefined1  [4])0x68706c61) {
                  local_44 = '\x01';
                }
                else if (stack0xfffffffffffffe93 == 0x746967 &&
                         auVar7 == (undefined1  [4])0x67696478) {
                  local_45 = '\x01';
                }
                else if (sVar8 == 0x74 && auVar7 == (undefined1  [4])0x6e697270) {
                  local_43 = '\x01';
                }
                else if (sVar8 == 0x68 && auVar7 == (undefined1  [4])0x70617267) {
                  local_40 = '\x01';
                }
                else if (sVar8 == 0x65 && auVar7 == (undefined1  [4])0x63617073) {
                  local_3f = '\x01';
                }
                else if (sVar8 == 0x6b && auVar7 == (undefined1  [4])0x6e616c62) {
                  local_42 = '\x01';
                }
                else if (sVar8 == 0x72 && auVar7 == (undefined1  [4])0x65707075) {
                  local_3e = '\x01';
                }
                else {
                  if (sVar8 != 0x72 || auVar7 != (undefined1  [4])0x65776f6c) goto LAB_001268ad;
                  local_41 = '\x01';
                }
                bVar3 = false;
              }
LAB_001268ad:
              maxstars = local_158;
              if (!bVar3) break;
            }
            local_148[bVar1] = '\x01';
            pbVar15 = local_160 + 1;
            break;
          case 0x5c:
            local_160 = pbVar15 + 1;
            if (pbVar15[1] == 0) {
              local_148[0x5c] = 1;
              pbVar15 = local_160;
            }
            else {
LAB_001267ec:
              setcharorrange(&local_160,local_148);
              pbVar15 = local_160;
            }
            break;
          case 0x5d:
            if (bVar4) goto LAB_0012695f;
            local_160 = local_160 + 1;
            local_148[bVar1] = '\x01';
            bVar4 = true;
            iVar10 = 1;
            goto LAB_001268c8;
          case 0x5e:
            goto switchD_0012659a_caseD_5e;
          default:
            if (bVar1 != 0x21) goto LAB_001267ec;
            goto switchD_0012659a_caseD_5e;
          }
          local_160 = pbVar15;
          bVar4 = true;
LAB_001268c5:
          iVar10 = 0;
        }
LAB_001268c8:
        bVar1 = *local_160;
        pbVar15 = local_160;
      } while (bVar1 != 0);
    }
    bVar4 = false;
    unaff_EBX = 1;
  }
  goto LAB_00126951;
  while (pbVar16 = string + 1, pbVar15 = string + 1, string = pbVar16, *pbVar15 != 0) {
LAB_00126925:
    iVar10 = loop(pattern,string,maxstars);
    if (iVar10 == 0) goto LAB_0012694c;
  }
LAB_00126947:
  bVar4 = false;
  goto LAB_00126951;
LAB_0012694c:
  unaff_EBX = 0;
  pbVar16 = string;
LAB_0012694e:
  bVar4 = false;
LAB_00126951:
  string = pbVar16;
  if (!bVar4) {
    return unaff_EBX;
  }
  goto LAB_00126479;
switchD_0012659a_caseD_5e:
  if (bVar4) {
    local_148[bVar1] = '\x01';
  }
  else if (local_48 == '\0') {
    local_48 = '\x01';
  }
  else {
    local_148[bVar1] = '\x01';
    bVar4 = true;
  }
LAB_001267a9:
  local_160 = local_160 + 1;
  goto LAB_001268c5;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}